

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ObjCollectMulti_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  
  while ((pObj == pRoot ||
         (((((ulong)pObj & 1) == 0 &&
           (uVar2 = (uint)*(undefined8 *)&pObj->field_0x18, (uVar2 & 7) != 2)) &&
          (((uVar2 ^ *(uint *)&pRoot->field_0x18) & 7) == 0))))) {
    Aig_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
    pObj = pObj->pFanin1;
  }
  iVar1 = vSuper->nSize;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if ((Aig_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (iVar1 == vSuper->nCap) {
    if (iVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar1 = vSuper->nSize;
  vSuper->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Aig_ObjCollectMulti_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjType(pRoot) != Aig_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild0(pObj), vSuper );
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild1(pObj), vSuper );
}